

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O3

int64_t cornelich::vanilla_index::count_index_entries(region *region)

{
  long lVar1;
  long lVar2;
  
  lVar2 = region->m_size;
  if (lVar2 == 0) {
    return 0;
  }
  lVar1 = 0;
  do {
    if (*(long *)((long)(region->m_region).m_base + lVar1 * 8) == 0) {
      return lVar1;
    }
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + -8;
  } while (lVar2 != 0);
  return lVar1;
}

Assistant:

std::int64_t vanilla_index::count_index_entries(const region & region)
{
    std::int64_t indices = 0;
    for(auto offset = 0LL; offset != region.size(); offset += 8)
    {
        if(!*reinterpret_cast<const std::int64_t*>(region.data() + offset))
            break;
        ++indices;
    }
    return indices;
}